

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

void adt_list_destroy(adt_list_t *self)

{
  _func_void_void_ptr *p_Var1;
  adt_list_elem_t *pNext;
  _func_void_void_ptr *destructor;
  adt_list_elem_t *iter;
  adt_list_t *self_local;
  
  if (self != (adt_list_t *)0x0) {
    destructor = (_func_void_void_ptr *)self->pFirst;
    pNext = (adt_list_elem_t *)0x0;
    if ((adt_list_elem_t *)destructor != (adt_list_elem_t *)0x0) {
      if (((self->destructorEnable & 1U) != 0) && (self->pDestructor != (_func_void_void_ptr *)0x0))
      {
        pNext = (adt_list_elem_t *)self->pDestructor;
      }
      while (destructor != (_func_void_void_ptr *)0x0) {
        p_Var1 = *(_func_void_void_ptr **)destructor;
        if (pNext != (adt_list_elem_t *)0x0) {
          (*(code *)pNext)(*(undefined8 *)(destructor + 0x10));
        }
        adt_list_elem_delete((adt_list_elem_t *)destructor);
        destructor = p_Var1;
      }
    }
  }
  return;
}

Assistant:

void  adt_list_destroy(adt_list_t *self)
{
   if (self != 0)
   {
      adt_list_elem_t *iter = self->pFirst;
      void (*destructor)(void*) = (void (*)(void*)) 0;
      if (iter == 0)
      {
         return; //empty list
      }
      if ( (self->destructorEnable != false) && (self->pDestructor != 0) )
      {
         destructor = self->pDestructor;
      }
      while( iter != 0 )
      {
         adt_list_elem_t *pNext = iter->pNext;
         if (destructor != 0)
         {
            destructor(iter->pItem);
         }
         adt_list_elem_delete(iter);
         iter=pNext;
      }
   }
}